

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::FileExists(char *filename,bool isFile)

{
  allocator local_41;
  string local_40;
  byte local_19;
  char *pcStack_18;
  bool isFile_local;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local._7_1_ = 0;
  }
  else {
    local_19 = isFile;
    pcStack_18 = filename;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,filename,&local_41);
    filename_local._7_1_ = FileExists(&local_40,(bool)(local_19 & 1));
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return (bool)(filename_local._7_1_ & 1);
}

Assistant:

bool SystemTools::FileExists(const char* filename, bool isFile)
{
  if(!filename)
    {
    return false;
    }
  return SystemTools::FileExists(std::string(filename), isFile);
}